

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O1

void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference
               (IfcPolygonalBoundedHalfSpace *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  iterator __first;
  aiVector3t<double> *__args;
  pointer pcVar1;
  iterator iVar2;
  undefined8 uVar3;
  pointer paVar4;
  double dVar5;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *pvVar6;
  bool bVar7;
  bool bVar8;
  IfcSurface *pIVar9;
  long lVar10;
  IfcAxis2Placement3D *pIVar11;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  IfcBoundedCurve *curve;
  vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *pvVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  TempMesh *pTVar17;
  IfcVector3 *pIVar18;
  IfcVector3 *__args_00;
  undefined8 *puVar19;
  aiMatrix4x4t<double> *paVar20;
  ulong uVar21;
  uint *puVar22;
  TempMesh *pTVar23;
  byte bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  char *unaff_retaddr;
  IfcVector3 e1;
  IfcVector3 ei;
  IfcVector3 e1_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> blackside;
  IfcVector3 polyNormal;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  IfcVector3 e0;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> whiteside;
  IfcMatrix4 proj;
  IfcVector3 p;
  IfcMatrix4 proj_inv;
  aiVector3t<double> res_3;
  IfcVector3 profileNormal;
  IfcVector3 local_388;
  double local_368;
  double local_360;
  IfcVector3 local_358;
  IfcVector3 local_338;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_318;
  double local_300;
  TempMesh *local_2f8;
  double local_2f0;
  double local_2e8;
  uint local_2dc;
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> local_2d8;
  IfcVector3 local_2a8;
  TempMesh *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  TempMesh *local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  undefined1 local_248 [16];
  double local_238;
  double dStack_230;
  ulong local_228;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_218;
  aiMatrix4x4t<double> local_1f8;
  IfcVector3 local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  double dStack_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  double local_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  double local_d8;
  ulong uStack_d0;
  aiVector3t<double> local_c8;
  IfcVector3 local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  uint *local_88;
  uint *local_80;
  ulong local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  ulong uStack_40;
  
  bVar24 = 0;
  local_2f8 = first_operand;
  if (hs == (IfcPolygonalBoundedHalfSpace *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x187,
                  "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar9 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcSurface>
                     (*(LazyObject **)
                       &(hs->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                        field_0x30);
  lVar10 = __dynamic_cast((_func_int *)
                          ((long)&(pIVar9->super_IfcGeometricRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper +
                          (long)(pIVar9->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                          &Schema_2x3::IfcPlane::typeinfo,0xffffffffffffffff);
  if (lVar10 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  local_178.x = 0.0;
  local_178.y = 0.0;
  local_178.z = 0.0;
  local_2a8.x = 0.0;
  local_2a8.y = 0.0;
  local_2a8.z = 1.0;
  local_280 = result;
  pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar10 + 0x40));
  if (pIVar11->field_0x50 == '\x01') {
    pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)(lVar10 + 0x40));
    if (pIVar11->field_0x50 == '\0') {
      __assert_fail("have",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/./code/Step/STEPFile.h"
                    ,0x240,
                    "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>]"
                   );
    }
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                   (*(LazyObject **)&(pIVar11->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_2a8,in);
  }
  pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar10 + 0x40));
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(pIVar11->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30
                    );
  ConvertCartesianPoint(&local_178,in_00);
  local_158 = (undefined1  [8])&PTR__PrimitiveDataType_008c31e0;
  pcVar1 = (hs->super_IfcHalfSpaceSolid).AgreementFlag._M_dataplus._M_p;
  local_150._M_p = (pointer)&local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,
             pcVar1 + (hs->super_IfcHalfSpaceSolid).AgreementFlag._M_string_length);
  local_158 = (undefined1  [8])&PTR__PrimitiveDataType_008c31a8;
  bVar7 = IsTrue((BOOLEAN *)local_158);
  local_158 = (undefined1  [8])&PTR__PrimitiveDataType_008c31e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != &local_140) {
    operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    local_2a8.x = -local_2a8.x;
    local_2a8.y = -local_2a8.y;
    local_2a8.z = -local_2a8.z;
  }
  dVar25 = local_2a8.z * local_2a8.z + local_2a8.x * local_2a8.x + local_2a8.y * local_2a8.y;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  dVar25 = 1.0 / dVar25;
  local_2a8.x = local_2a8.x * dVar25;
  local_2a8.y = local_2a8.y * dVar25;
  local_2a8.z = dVar25 * local_2a8.z;
  local_290 = (TempMesh *)operator_new(0x30);
  (local_290->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_290->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_290->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_290->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_290->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_290->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
            (&local_288,local_290);
  curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                    ((hs->PolygonalBoundary).obj);
  bVar7 = ProcessCurve(&curve->super_IfcCurve,local_290,conv);
  if (bVar7) {
    pIVar18 = (local_290->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    TempMesh::ComputePolygonNormal
              (&local_a8,pIVar18,
               ((long)(local_290->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar18 >> 3) *
               -0x5555555555555555,true);
    local_158 = (undefined1  [8])0x3ff0000000000000;
    local_150._M_p = (pointer)0x0;
    dStack_148 = 0.0;
    local_140._M_allocated_capacity = 0;
    local_140._8_8_ = 0.0;
    local_130 = 1.0;
    local_128 = 0.0;
    dStack_120 = 0.0;
    local_118 = 0.0;
    dStack_110 = 0.0;
    local_108 = 1.0;
    local_100 = 0.0;
    dStack_f8 = 0.0;
    local_f0 = 0.0;
    dStack_e8 = 0.0;
    local_e0 = 1.0;
    pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)&(hs->super_IfcHalfSpaceSolid).field_0x68);
    ConvertAxisPlacement((IfcMatrix4 *)local_158,pIVar11);
    pdVar14 = (double *)local_158;
    paVar20 = &local_1f8;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      paVar20->a1 = *pdVar14;
      pdVar14 = pdVar14 + (ulong)bVar24 * -2 + 1;
      paVar20 = (aiMatrix4x4t<double> *)((long)paVar20 + (ulong)bVar24 * -0x10 + 8);
    }
    aiMatrix4x4t<double>::Inverse(&local_1f8);
    pTVar23 = local_280;
    pTVar17 = local_2f8;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&local_280->mVerts,
               ((long)(local_2f8->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(local_2f8->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_90 = &pTVar23->mVertcnt;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (local_90,(long)(pTVar17->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar17->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
    puVar22 = (pTVar17->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_88 = (pTVar17->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (puVar22 != local_88) {
      local_2dc = 0;
      do {
        local_218.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (IfcVector3 *)0x0;
        local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (IfcVector3 *)0x0;
        uVar13 = (ulong)*puVar22;
        local_80 = puVar22;
        if (uVar13 != 0) {
          pIVar18 = (pTVar17->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_2dc;
          TempMesh::ComputePolygonNormal((IfcVector3 *)&local_2d8,pIVar18,uVar13,true);
          dVar25 = (pIVar18->x - local_178.x) * local_2a8.x;
          if (ABS(local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y * local_2a8.z +
                  (double)local_2d8.
                          super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                          super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                          super__Tuple_impl<2UL,_unsigned_long>.
                          super__Head_base<2UL,_unsigned_long,_false>._M_head_impl * local_2a8.x +
                  local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x * local_2a8.y) <=
              0.9999) {
            bVar7 = -1e-06 < (pIVar18->z - local_178.z) * local_2a8.z +
                             dVar25 + local_2a8.y * (pIVar18->y - local_178.y);
            __args_00 = pIVar18;
            uVar15 = 1;
            do {
              local_238 = __args_00->z;
              local_248._0_8_ = __args_00->x;
              local_248._8_8_ = __args_00->y;
              uVar16 = 0;
              if (uVar15 != uVar13) {
                uVar16 = uVar15;
              }
              local_388.z = pIVar18[uVar16].z;
              local_388.x = pIVar18[uVar16].x;
              local_388.y = pIVar18[uVar16].y;
              local_358.x = 0.0;
              local_358.y = 0.0;
              pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_318;
              if (bVar7 != false) {
                pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &local_218;
              }
              local_358.z = 0.0;
              iVar2._M_current = *(aiVector3t<double> **)(pvVar12 + 8);
              if (iVar2._M_current == *(aiVector3t<double> **)(pvVar12 + 0x10)) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>(pvVar12,iVar2,__args_00);
              }
              else {
                (iVar2._M_current)->z = __args_00->z;
                dVar25 = __args_00->y;
                (iVar2._M_current)->x = __args_00->x;
                (iVar2._M_current)->y = dVar25;
                *(long *)(pvVar12 + 8) = *(long *)(pvVar12 + 8) + 0x18;
              }
              bVar8 = IntersectSegmentPlane
                                (&local_178,&local_2a8,(IfcVector3 *)local_248,&local_388,bVar7,
                                 &local_358);
              if (bVar8) {
                iVar2._M_current = *(aiVector3t<double> **)(pvVar12 + 8);
                if ((*(aiVector3t<double> **)pvVar12 == iVar2._M_current) ||
                   (dVar25 = iVar2._M_current[-1].x - local_358.x,
                   dVar29 = iVar2._M_current[-1].y - local_358.y,
                   dVar28 = iVar2._M_current[-1].z - local_358.z,
                   1e-12 < dVar28 * dVar28 + dVar25 * dVar25 + dVar29 * dVar29)) {
                  if (iVar2._M_current == *(aiVector3t<double> **)(pvVar12 + 0x10)) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>(pvVar12,iVar2,&local_358);
                  }
                  else {
                    (iVar2._M_current)->z = local_358.z;
                    (iVar2._M_current)->x = local_358.x;
                    (iVar2._M_current)->y = local_358.y;
                    *(long *)(pvVar12 + 8) = *(long *)(pvVar12 + 8) + 0x18;
                  }
                }
                pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &local_218;
                if (bVar7 != false) {
                  pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                            &local_318;
                }
                iVar2._M_current = *(aiVector3t<double> **)(pvVar12 + 8);
                pvVar6 = &local_218;
                if (bVar7 != false) {
                  pvVar6 = &local_318;
                }
                if (iVar2._M_current ==
                    (pvVar6->
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                            &local_218;
                  if (bVar7 != false) {
                    pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                              &local_318;
                  }
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_realloc_insert<aiVector3t<double>const&>(pvVar12,iVar2,&local_358);
                }
                else {
                  (iVar2._M_current)->z = local_358.z;
                  (iVar2._M_current)->x = local_358.x;
                  (iVar2._M_current)->y = local_358.y;
                  *(pointer *)(pvVar12 + 8) = *(pointer *)(pvVar12 + 8) + 1;
                }
                bVar7 = (bool)(bVar7 ^ 1);
              }
              __args_00 = __args_00 + 1;
              bVar8 = uVar15 != uVar13;
              pTVar17 = local_2f8;
              uVar15 = uVar15 + 1;
            } while (bVar8);
          }
          else {
            pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_318;
            if (-1e-06 < (pIVar18->z - local_178.z) * local_2a8.z +
                         dVar25 + local_2a8.y * (pIVar18->y - local_178.y)) {
              pvVar12 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_218;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_range_insert<aiVector3t<double>const*>(pvVar12,*(undefined8 *)(pvVar12 + 8),pIVar18);
          }
          pTVar23 = local_280;
          WritePolygon(&local_218,local_280);
          FilterPolygon(&local_318);
          if (local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_388.x = 0.0;
            local_388.y = 0.0;
            local_388.z = 0.0;
            dVar25 = (local_318.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x;
            dVar29 = (local_318.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->y;
            dVar28 = (local_318.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->z;
            local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
            _M_head_impl = (_Head_base<2UL,_unsigned_long,_false>)
                           (local_1f8.a3 * dVar28 + local_1f8.a1 * dVar25 + local_1f8.a2 * dVar29 +
                           local_1f8.a4);
            local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                 local_1f8.b3 * dVar28 + local_1f8.b1 * dVar25 + local_1f8.b2 * dVar29 +
                 local_1f8.b4;
            local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
            super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
            super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                 dVar28 * local_1f8.c3 + dVar25 * local_1f8.c1 + dVar29 * local_1f8.c2 +
                 local_1f8.c4;
            bVar7 = PointInPoly((IfcVector3 *)&local_2d8,&local_290->mVerts);
            local_360 = (double)CONCAT71(local_360._1_7_,bVar7);
            local_358.x = 0.0;
            local_358.y = 0.0;
            local_358.z = 0.0;
            if ((long)local_318.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_318.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              uVar15 = ((long)local_318.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_318.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              uVar13 = 0;
              do {
                dVar25 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].x;
                dVar29 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].y;
                dVar28 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].z;
                local_368 = local_1f8.a3 * dVar28 + local_1f8.a1 * dVar25 + local_1f8.a2 * dVar29 +
                            local_1f8.a4;
                local_300 = local_1f8.b3 * dVar28 + local_1f8.b1 * dVar25 + dVar29 * local_1f8.b2 +
                            local_1f8.b4;
                dVar25 = dVar28 * local_1f8.c3 + dVar25 * local_1f8.c1 + dVar29 * local_1f8.c2 +
                         local_1f8.c4;
                uVar16 = uVar13 + 1;
                uVar21 = uVar16;
                if (uVar16 == uVar15) {
                  uVar21 = 0;
                }
                dVar29 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].y;
                dVar28 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].x;
                dVar30 = local_318.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].z;
                local_338.x = local_1f8.a3 * dVar30 + local_1f8.a1 * dVar28 + local_1f8.a2 * dVar29
                              + local_1f8.a4;
                local_338.y = local_1f8.b3 * dVar30 + local_1f8.b1 * dVar28 + local_1f8.b2 * dVar29
                              + local_1f8.b4;
                local_338.z = local_1f8.c3 * dVar30 + local_1f8.c1 * dVar28 + local_1f8.c2 * dVar29
                              + local_1f8.c4;
                if (local_358.y != local_358.x) {
                  local_358.y = local_358.x;
                }
                local_248._0_8_ = local_368;
                local_248._8_8_ = local_300;
                local_238 = dVar25;
                IntersectsBoundaryProfile
                          ((IfcVector3 *)local_248,&local_338,&local_290->mVerts,bVar7,
                           (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                            *)&local_358,false);
                if (0x20 < (ulong)((long)local_358.y - (long)local_358.x)) {
                  do {
                    if ((long)local_358.y - (long)local_358.x == 0x20) break;
                    lVar10 = 0;
                    bVar8 = false;
                    uVar15 = 0;
                    do {
                      dVar29 = *(double *)((long)local_358.x + lVar10 + 0x28) - local_368;
                      dVar30 = *(double *)((long)local_358.x + lVar10 + 0x30) - local_300;
                      dVar26 = *(double *)((long)local_358.x + lVar10 + 0x38) - dVar25;
                      dVar28 = *(double *)((long)local_358.x + lVar10 + 8) - local_368;
                      dVar5 = *(double *)((long)local_358.x + lVar10 + 0x10) - local_300;
                      dVar27 = *(double *)((long)local_358.x + lVar10 + 0x18) - dVar25;
                      if (dVar26 * dVar26 + dVar29 * dVar29 + dVar30 * dVar30 <
                          dVar27 * dVar27 + dVar28 * dVar28 + dVar5 * dVar5) {
                        pdVar14 = (double *)((long)local_358.x + lVar10 + 0x28);
                        puVar19 = (undefined8 *)((long)local_358.x + lVar10);
                        uVar3 = puVar19[4];
                        puVar19[4] = *puVar19;
                        *puVar19 = uVar3;
                        local_2d8.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                             *(double *)((long)local_358.x + lVar10 + 0x38);
                        local_2d8.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<2UL,_unsigned_long>.
                        super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_long,_false>)*pdVar14;
                        local_2d8.
                        super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                        super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                        super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                             *(double *)((long)local_358.x + lVar10 + 0x30);
                        *(undefined8 *)((long)local_358.x + lVar10 + 0x38) =
                             *(undefined8 *)((long)local_358.x + lVar10 + 0x18);
                        *pdVar14 = *(double *)((long)local_358.x + lVar10 + 8);
                        *(undefined8 *)((long)local_358.x + lVar10 + 0x30) =
                             *(undefined8 *)((long)local_358.x + lVar10 + 0x10);
                        *(double *)((long)local_358.x + lVar10 + 0x18) =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                        *(_Head_base<2UL,_unsigned_long,_false> *)((long)local_358.x + lVar10 + 8) =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Tuple_impl<2UL,_unsigned_long>.
                             super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                        *(double *)((long)local_358.x + lVar10 + 0x10) =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                        bVar8 = true;
                      }
                      uVar15 = uVar15 + 1;
                      lVar10 = lVar10 + 0x20;
                    } while (uVar15 < ((long)local_358.y - (long)local_358.x >> 5) - 1U);
                  } while (bVar8);
                }
                uVar15 = (long)local_358.y - (long)local_358.x;
                if (uVar15 != 0) {
                  lVar10 = 0x18;
                  uVar21 = 0;
                  do {
                    dVar25 = *(double *)((long)local_358.x + lVar10 + -0x10);
                    dVar29 = *(double *)((long)local_358.x + lVar10 + -8);
                    dVar28 = *(double *)((long)local_358.x + lVar10);
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                         dStack_148 * dVar28 +
                         (double)local_158 * dVar25 + (double)local_150._M_p * dVar29 +
                         (double)local_140._M_allocated_capacity;
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         local_128 * dVar28 + (double)local_140._8_8_ * dVar25 + local_130 * dVar29
                         + dStack_120;
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                         dVar28 * local_108 + dVar25 * local_118 + dVar29 * dStack_110 + local_100;
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         *(_Head_base<2UL,_unsigned_long,_false> *)
                          ((long)local_358.x + lVar10 + -0x18);
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar13;
                    std::
                    vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
                    ::emplace_back<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>
                              ((vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>
                                *)&local_388,&local_2d8);
                    uVar21 = uVar21 + 1;
                    uVar15 = (long)local_358.y - (long)local_358.x;
                    lVar10 = lVar10 + 0x20;
                  } while (uVar21 < (ulong)((long)uVar15 >> 5));
                }
                bVar7 = (bool)(bVar7 ^ (byte)(uVar15 >> 5) & 1);
                uVar15 = ((long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                uVar13 = uVar16;
                pTVar23 = local_280;
              } while (uVar16 < uVar15);
            }
            uVar13 = ((long)local_388.y - (long)local_388.x >> 3) * -0x3333333333333333;
            if ((uVar13 & 1) == 0) {
              if (1 < uVar13) {
                if ((local_360._0_1_ == '\0') && ((long)local_388.y - (long)local_388.x != 0x28)) {
                  uVar13 = ((long)local_388.y - (long)local_388.x >> 3) * -0x3333333333333333;
                  lVar10 = 0;
                  uVar15 = 0;
                  do {
                    uVar13 = ((uVar13 + uVar15) - 1) % uVar13;
                    uVar3 = *(undefined8 *)((long)local_388.x + lVar10 + 0x20);
                    *(undefined8 *)((long)local_388.x + lVar10 + 0x20) =
                         *(undefined8 *)((long)local_388.x + (uVar13 * 5 + 4) * 8);
                    *(undefined8 *)((long)local_388.x + (uVar13 * 5 + 4) * 8) = uVar3;
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         *(double *)((long)local_388.x + lVar10 + 0x18);
                    pdVar14 = (double *)((long)local_388.x + lVar10 + 8);
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_long,_false>)*pdVar14;
                    local_2d8.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x = pdVar14[1];
                    *(undefined8 *)((long)local_388.x + lVar10 + 0x18) =
                         *(undefined8 *)((long)local_388.x + (uVar13 * 5 + 3) * 8);
                    uVar3 = *(undefined8 *)((long)local_388.x + (uVar13 * 5 + 2) * 8);
                    puVar19 = (undefined8 *)((long)local_388.x + lVar10 + 8);
                    *puVar19 = *(undefined8 *)((long)local_388.x + (uVar13 * 5 + 1) * 8);
                    puVar19[1] = uVar3;
                    *(double *)((long)local_388.x + (uVar13 * 5 + 3) * 8) =
                         local_2d8.
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                    *(_Head_base<2UL,_unsigned_long,_false> *)
                     ((long)local_388.x + (uVar13 * 5 + 1) * 8) =
                         local_2d8.
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Tuple_impl<2UL,_unsigned_long>.
                         super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                    *(double *)((long)local_388.x + (uVar13 * 5 + 2) * 8) =
                         local_2d8.
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                    uVar3 = *(undefined8 *)((long)local_388.x + lVar10);
                    *(undefined8 *)((long)local_388.x + lVar10) =
                         *(undefined8 *)((long)local_388.x + uVar13 * 5 * 8);
                    *(undefined8 *)((long)local_388.x + uVar13 * 5 * 8) = uVar3;
                    uVar15 = uVar15 + 1;
                    uVar13 = ((long)local_388.y - (long)local_388.x >> 3) * -0x3333333333333333;
                    lVar10 = lVar10 + 0x28;
                  } while (uVar15 < uVar13 - 1);
                }
                lVar10 = (long)local_388.y - (long)local_388.x;
                uVar13 = (lVar10 >> 3) * -0x3333333333333333;
                if (lVar10 != 0x28 && lVar10 != 0) {
                  uVar15 = 0;
                  do {
                    uVar13 = (uVar15 + 1) % uVar13;
                    uVar16 = uVar15 + 1;
                    if ((*(double *)((long)local_388.x + (uVar15 * 5 + 3) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 3) * 8)) *
                        (*(double *)((long)local_388.x + (uVar15 * 5 + 3) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 3) * 8)) +
                        (*(double *)((long)local_388.x + (uVar15 * 5 + 1) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 1) * 8)) *
                        (*(double *)((long)local_388.x + (uVar15 * 5 + 1) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 1) * 8)) +
                        (*(double *)((long)local_388.x + (uVar15 * 5 + 2) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 2) * 8)) *
                        (*(double *)((long)local_388.x + (uVar15 * 5 + 2) * 8) -
                        *(double *)((long)local_388.x + (uVar13 * 5 + 2) * 8)) < 1e-10) {
                      std::
                      vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      ::_M_erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)&local_388,
                                 (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 ((long)local_388.x + uVar15 * 5 * 8),
                                 (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 ((long)local_388.x + uVar15 * 5 * 8) + 2);
                      uVar16 = uVar15;
                    }
                    uVar13 = ((long)local_388.y - (long)local_388.x >> 3) * -0x3333333333333333;
                  } while ((local_388.y != local_388.x) && (uVar15 = uVar16, uVar16 < uVar13 - 1));
                }
                if ((1 < uVar13) &&
                   ((*(double *)((long)local_388.y + -0x10) - *(double *)((long)local_388.x + 0x18))
                    * (*(double *)((long)local_388.y + -0x10) -
                      *(double *)((long)local_388.x + 0x18)) +
                    (*(double *)((long)local_388.y + -0x20) - *(double *)((long)local_388.x + 8)) *
                    (*(double *)((long)local_388.y + -0x20) - *(double *)((long)local_388.x + 8)) +
                    (*(double *)((long)local_388.y + -0x18) - *(double *)((long)local_388.x + 0x10))
                    * (*(double *)((long)local_388.y + -0x18) -
                      *(double *)((long)local_388.x + 0x10)) < 1e-10)) {
                  if (((undefined8 *)((long)local_388.x + 0x28) !=
                       (undefined8 *)((long)local_388.y + -0x28)) &&
                     (uVar13 = ((long)local_388.y + -0x28) - ((long)local_388.x + 0x28),
                     0 < (long)uVar13)) {
                    lVar10 = uVar13 / 0x28 + 1;
                    puVar19 = (undefined8 *)local_388.x;
                    do {
                      puVar19[1] = puVar19[6];
                      puVar19[2] = puVar19[7];
                      puVar19[3] = puVar19[8];
                      puVar19[4] = puVar19[9];
                      *puVar19 = puVar19[5];
                      puVar19 = puVar19 + 5;
                      lVar10 = lVar10 + -1;
                    } while (1 < lVar10);
                  }
                  local_388.y = (double)((long)local_388.y + -0x50);
                }
              }
              dVar25 = local_1f8.c1;
              pTVar17 = local_2f8;
              if (local_388.x == local_388.y) {
                if (local_360._0_1_ == '\0') {
                  local_2d8.super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                  .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
                  _M_head_impl._0_4_ =
                       (int)((ulong)((long)local_318.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_318.
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(local_90,(uint *)&local_2d8);
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                             pTVar23,(pTVar23->mVerts).
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                             local_318.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_318.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              else {
                local_2e8 = local_1f8.a1;
                local_250 = local_1f8.a2;
                local_270 = local_1f8.a3;
                local_300 = local_1f8.b1;
                local_360 = local_1f8.b2;
                local_278 = local_1f8.b3;
                local_368 = local_1f8.c2;
                local_d8 = local_1f8.c3;
                uStack_d0 = 0;
                TempMesh::ComputePolygonNormal
                          ((IfcVector3 *)&local_2d8,
                           local_318.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           ((long)local_318.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_318.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555,true);
                if (local_388.x != local_388.y) {
                  local_270 = local_270 *
                              local_2d8.
                              super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                              .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                              super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                              local_2e8 *
                              (double)local_2d8.
                                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                      .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                      super__Tuple_impl<2UL,_unsigned_long>.
                                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                              local_250 *
                              local_2d8.
                              super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                              .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                              super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                  local_278 = local_278 *
                              local_2d8.
                              super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                              .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                              super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                              local_300 *
                              (double)local_2d8.
                                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                      .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                      super__Tuple_impl<2UL,_unsigned_long>.
                                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                              local_360 *
                              local_2d8.
                              super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                              .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                              super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                  local_d8 = local_d8 *
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y +
                             dVar25 * (double)local_2d8.
                                              super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                              .
                                              super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>
                                              .super__Tuple_impl<2UL,_unsigned_long>.
                                              super__Head_base<2UL,_unsigned_long,_false>.
                                              _M_head_impl +
                             local_368 *
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                  local_68 = local_a8.z * local_d8 + local_a8.x * local_270 + local_a8.y * local_278
                  ;
                  local_78 = (ulong)(0.0 <= local_68);
                  local_48 = ABS(local_d8);
                  uStack_40 = uStack_d0 & 0x7fffffffffffffff;
                  local_70 = *(double *)(&DAT_006e3d60 + local_78 * 8);
                  do {
                    local_338.x = 0.0;
                    local_338.y = 0.0;
                    local_338.z = 0.0;
                    uVar13 = 0;
                    do {
                      uVar16 = ((long)local_388.y - (long)local_388.x >> 3) * -0x3333333333333333;
                      uVar15 = uVar13 + 1;
                      if (uVar16 < uVar15 || uVar16 - uVar15 == 0) {
                        __assert_fail("intersections.size() > currentIntersecIdx + 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                                      ,0x26a,
                                      "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                                     );
                      }
                      __first._M_current =
                           (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                           ((long)local_388.x + uVar13 * 5 * 8);
                      local_2d8.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
                           ((__first._M_current)->
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>)
                           .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
                      local_2d8.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<2UL,_unsigned_long>.
                      super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_long,_false>)
                           ((__first._M_current)->
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>)
                           .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Tuple_impl<2UL,_unsigned_long>.
                           super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                      local_2d8.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                           ((__first._M_current)->
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>)
                           .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                      local_2d8.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                           ((__first._M_current)->
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>)
                           .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                      local_2d8.
                      super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                      super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                      super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                           ((__first._M_current)->
                           super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>)
                           .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                           super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                      local_228 = *(undefined8 *)((long)local_388.x + (uVar15 * 5 + 4) * 8);
                      local_248._0_8_ = *(double *)((long)local_388.x + uVar15 * 5 * 8);
                      local_248._8_8_ = ((double *)((long)local_388.x + uVar15 * 5 * 8))[1];
                      local_238 = *(double *)((long)local_388.x + (uVar15 * 5 + 2) * 8);
                      dStack_230 = *(double *)((long)local_388.x + (uVar15 * 5 + 3) * 8);
                      std::
                      vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      ::_M_erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)&local_388,__first,
                                 (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                 ((long)local_388.x + (uVar13 + 2) * 5 * 8));
                      if (local_338.y == local_338.z) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   &local_338,(iterator)local_338.y,
                                   &local_2d8.
                                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                    .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl);
                      }
                      else {
                        *(double *)((long)local_338.y + 0x10) =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                        *(double *)local_338.y =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                        *(double *)((long)local_338.y + 8) =
                             local_2d8.
                             super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                             .super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                             super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                        local_338.y = (double)((long)local_338.y + 0x18);
                      }
                      if (local_228 <
                          local_2d8.
                          super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
                        lVar10 = ((long)local_318.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_318.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555;
                      }
                      else {
                        lVar10 = 0;
                      }
                      uVar13 = (local_228 -
                               local_2d8.
                               super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) + lVar10;
                      if (uVar13 != 0) {
                        uVar15 = 1;
                        do {
                          __args = local_318.
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                   (local_2d8.
                                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl +
                                   uVar15) % (ulong)(((long)local_318.
                                                                                                                        
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_318.
                                                                                                                
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                  -0x5555555555555555);
                          if (local_338.y == local_338.z) {
                            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                            _M_realloc_insert<aiVector3t<double>const&>
                                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                                        *)&local_338,(iterator)local_338.y,__args);
                          }
                          else {
                            *(double *)((long)local_338.y + 0x10) = __args->z;
                            dVar25 = __args->y;
                            *(double *)local_338.y = __args->x;
                            *(double *)((long)local_338.y + 8) = dVar25;
                            local_338.y = (double)((long)local_338.y + 0x18);
                          }
                          uVar15 = uVar15 + 1;
                        } while (uVar15 <= uVar13);
                      }
                      if (local_338.y == local_338.z) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   &local_338,(iterator)local_338.y,
                                   (aiVector3t<double> *)(local_248 + 8));
                      }
                      else {
                        *(double *)((long)local_338.y + 0x10) = dStack_230;
                        *(double *)local_338.y = (double)local_248._8_8_;
                        *(double *)((long)local_338.y + 8) = local_238;
                        local_338.y = (double)((long)local_338.y + 0x18);
                      }
                      local_360 = local_1f8.a3 * dStack_230 +
                                  local_1f8.a1 * (double)local_248._8_8_ + local_1f8.a2 * local_238
                                  + local_1f8.a4;
                      local_2e8 = local_1f8.b3 * dStack_230 +
                                  local_1f8.b1 * (double)local_248._8_8_ + local_1f8.b2 * local_238
                                  + local_1f8.b4;
                      local_300 = dStack_230 * local_1f8.c3 +
                                  (double)local_248._8_8_ * local_1f8.c1 + local_238 * local_1f8.c2
                                  + local_1f8.c4;
                      uVar15 = (local_248._0_8_ + local_78) %
                               (ulong)(((long)(local_290->mVerts).
                                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(local_290->mVerts).
                                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                      -0x5555555555555555);
                      do {
                        if (local_68 < 0.0) {
                          uVar16 = uVar15 + 1;
                        }
                        else {
                          uVar16 = (((long)(local_290->mVerts).
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_290->mVerts).
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555 + uVar15) - 1;
                        }
                        paVar4 = (local_290->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar16 = uVar16 % (ulong)(((long)(local_290->mVerts).
                                                                                                                  
                                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)paVar4 >> 3) * -0x5555555555555555);
                        local_258 = paVar4[uVar16].x;
                        local_260 = paVar4[uVar16].y;
                        if (local_48 <= 1e-05) {
                          dVar25 = paVar4[uVar15].z;
                          local_268 = paVar4[uVar16].z;
                        }
                        else {
                          dVar25 = ((paVar4[uVar15].y - local_2e8) * local_278) / local_d8 +
                                   ((paVar4[uVar15].x - local_360) * local_270) / local_d8 +
                                   local_300;
                          local_268 = ((local_260 - local_2e8) * local_278) / local_d8 +
                                      ((local_258 - local_360) * local_270) / local_d8 + local_300;
                        }
                        dVar28 = local_258 - paVar4[uVar15].x;
                        dVar29 = local_260 - paVar4[uVar15].y;
                        local_368 = dVar29 * local_a8.z - local_a8.y * (local_268 - dVar25);
                        local_2f0 = (local_268 - dVar25) * local_a8.x - local_a8.z * dVar28;
                        dVar29 = dVar28 * local_a8.y - dVar29 * local_a8.x;
                        dVar25 = dVar29 * dVar29 + local_368 * local_368 + local_2f0 * local_2f0;
                        if (dVar25 < 0.0) {
                          dVar25 = sqrt(dVar25);
                        }
                        else {
                          dVar25 = SQRT(dVar25);
                        }
                        dVar25 = 1.0 / dVar25;
                        dVar28 = local_2f0 * dVar25;
                        local_2f0 = dVar28 * local_d8 - local_278 * dVar25 * dVar29;
                        dVar29 = dVar25 * dVar29 * local_270 - local_d8 * local_368 * dVar25;
                        local_368 = local_368 * dVar25 * local_278 - local_270 * dVar28;
                        dVar25 = local_368 * local_368 + local_2f0 * local_2f0 + dVar29 * dVar29;
                        if (dVar25 < 0.0) {
                          dVar25 = sqrt(dVar25);
                        }
                        else {
                          dVar25 = SQRT(dVar25);
                        }
                        dVar25 = 1.0 / dVar25;
                        local_2f0 = local_2f0 * dVar25 * local_70;
                        dVar29 = dVar29 * dVar25 * local_70;
                        local_368 = dVar25 * local_368 * local_70;
                        dVar25 = 10000000000.0;
                        if (1e-05 < local_48) {
                          dVar25 = (local_268 - local_300) * (local_268 - local_300) +
                                   (local_258 - local_360) * (local_258 - local_360) +
                                   (local_260 - local_2e8) * (local_260 - local_2e8);
                          if (dVar25 < 0.0) {
                            dVar25 = sqrt(dVar25);
                          }
                          else {
                            dVar25 = SQRT(dVar25);
                          }
                          if (10000000000.0 <= dVar25) {
                            dVar25 = 10000000000.0;
                          }
                        }
                        dVar28 = *(double *)local_338.x;
                        dVar30 = *(double *)((long)local_338.x + 8);
                        local_50 = local_1f8.a2;
                        local_250 = local_1f8.a1;
                        dVar5 = *(double *)((long)local_338.x + 0x10);
                        local_58 = local_1f8.a3;
                        local_60 = local_1f8.a4;
                        dVar26 = (local_1f8.a3 * dVar5 +
                                  local_1f8.a1 * dVar28 + local_1f8.a2 * dVar30 + local_1f8.a4) -
                                 local_360;
                        dVar27 = (local_1f8.b3 * dVar5 +
                                  local_1f8.b1 * dVar28 + dVar30 * local_1f8.b2 + local_1f8.b4) -
                                 local_2e8;
                        dVar30 = (dVar5 * local_1f8.c3 +
                                  dVar28 * local_1f8.c1 + dVar30 * local_1f8.c2 + local_1f8.c4) -
                                 local_300;
                        dVar28 = dVar30 * local_368 + dVar26 * local_2f0 + dVar29 * dVar27;
                        uVar13 = 0xffffffffffffffff;
                        if (((-1e-06 < dVar28) && (dVar28 <= dVar25)) &&
                           (dVar26 = dVar26 - local_2f0 * dVar28, dVar27 = dVar27 - dVar29 * dVar28,
                           dVar30 = dVar30 - local_368 * dVar28,
                           dVar30 * dVar30 + dVar26 * dVar26 + dVar27 * dVar27 < 1e-10)) {
                          uVar13 = ((long)local_388.y - (long)local_388.x >> 3) *
                                   -0x3333333333333333;
                          dVar25 = dVar28;
                        }
                        if ((long)local_388.y - (long)local_388.x != 0) {
                          pdVar14 = (double *)((long)local_388.x + 0x18);
                          uVar21 = 0;
                          do {
                            dVar28 = pdVar14[-2];
                            dVar30 = pdVar14[-1];
                            dVar5 = *pdVar14;
                            dVar26 = (local_1f8.a3 * dVar5 +
                                      local_1f8.a1 * dVar28 + local_1f8.a2 * dVar30 + local_1f8.a4)
                                     - local_360;
                            dVar27 = (local_1f8.b3 * dVar5 +
                                      local_1f8.b1 * dVar28 + local_1f8.b2 * dVar30 + local_1f8.b4)
                                     - local_2e8;
                            dVar30 = (dVar5 * local_1f8.c3 +
                                      dVar28 * local_1f8.c1 + dVar30 * local_1f8.c2 + local_1f8.c4)
                                     - local_300;
                            dVar28 = dVar30 * local_368 + dVar26 * local_2f0 + dVar29 * dVar27;
                            if (((-1e-06 < dVar28) && (dVar28 <= dVar25)) &&
                               (dVar26 = dVar26 - local_2f0 * dVar28,
                               dVar27 = dVar27 - dVar29 * dVar28,
                               dVar30 = dVar30 - local_368 * dVar28,
                               dVar30 * dVar30 + dVar26 * dVar26 + dVar27 * dVar27 < 1e-10)) {
                              uVar13 = uVar21;
                              dVar25 = dVar28;
                            }
                            uVar21 = uVar21 + 2;
                            pdVar14 = pdVar14 + 10;
                          } while (uVar21 < (ulong)(((long)local_388.y - (long)local_388.x >> 3) *
                                                   -0x3333333333333333));
                        }
                        if (uVar13 == 0xffffffffffffffff) {
                          local_c8.x = dStack_148 * local_268 +
                                       (double)local_158 * local_258 +
                                       (double)local_150._M_p * local_260 +
                                       (double)local_140._M_allocated_capacity;
                          local_c8.y = local_128 * local_268 +
                                       (double)local_140._8_8_ * local_258 + local_130 * local_260 +
                                       dStack_120;
                          local_c8.z = local_108 * local_268 +
                                       local_118 * local_258 + dStack_110 * local_260 + local_100;
                          if (local_338.y == local_338.z) {
                            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                            _M_realloc_insert<aiVector3t<double>>
                                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                                        *)&local_338,(iterator)local_338.y,&local_c8);
                          }
                          else {
                            *(double *)((long)local_338.y + 0x10) = local_c8.z;
                            *(double *)local_338.y = local_c8.x;
                            *(double *)((long)local_338.y + 8) = local_c8.y;
                            local_338.y = (double)((long)local_338.y + 0x18);
                          }
                          local_300 = local_268;
                          local_2e8 = local_260;
                          local_360 = local_258;
                          uVar15 = uVar16;
                        }
                        uVar16 = ((long)local_338.y - (long)local_338.x >> 3) * -0x5555555555555555;
                        uVar21 = ((long)(local_290->mVerts).
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_290->mVerts).
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555 +
                                 ((long)local_318.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_318.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555;
                      } while (((uVar16 < uVar21 || uVar16 - uVar21 == 0) ||
                               (LogFunctions<Assimp::IFCImporter>::LogError((char *)0x55105f),
                               uVar16 < uVar21 || uVar16 - uVar21 == 0)) &&
                              (uVar13 == 0xffffffffffffffff));
                    } while (uVar13 < (ulong)(((long)local_388.y - (long)local_388.x >> 3) *
                                             -0x3333333333333333));
                    WritePolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )&local_338,local_280);
                    pTVar17 = local_2f8;
                    if ((double *)local_338.x != (double *)0x0) {
                      operator_delete((void *)local_338.x,(long)local_338.z - (long)local_338.x);
                    }
                  } while (local_388.x != local_388.y);
                }
              }
            }
            else {
              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5510ee);
              pTVar17 = local_2f8;
            }
            if ((void *)local_358.x != (void *)0x0) {
              operator_delete((void *)local_358.x,(long)local_358.z - (long)local_358.x);
            }
            if ((undefined8 *)local_388.x != (undefined8 *)0x0) {
              operator_delete((void *)local_388.x,(long)local_388.z - (long)local_388.x);
            }
          }
        }
        if (local_318.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (IfcVector3 *)0x0) {
          operator_delete(local_318.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_318.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        puVar22 = local_80;
        if (local_218.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_2dc = local_2dc + *puVar22;
        puVar22 = puVar22 + 1;
      } while (puVar22 != local_88);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x551207);
  }
  else {
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5511f9);
  }
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  return;
}

Assistant:

void ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace* hs, TempMesh& result,
                                                       const TempMesh& first_operand,
                                                       ConversionData& conv)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    n.Normalize();

    // obtain the polygonal bounding volume
    std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
    if(!ProcessCurve(hs->PolygonalBoundary, *profile.get(), conv)) {
        IFCImporter::LogError("expected valid polyline for boundary of boolean halfspace");
        return;
    }

    // determine winding order by calculating the normal.
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(profile->mVerts.data(), profile->mVerts.size());

    IfcMatrix4 proj_inv;
    ConvertAxisPlacement(proj_inv,hs->Position);

    // and map everything into a plane coordinate space so all intersection
    // tests can be done in 2D space.
    IfcMatrix4 proj = proj_inv;
    proj.Inverse();

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;
    std::vector<unsigned int>& outvertcnt = result.mVertcnt;

    outvert.reserve(in.size());
    outvertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin();
    std::vector<unsigned int>::const_iterator end = first_operand.mVertcnt.end();
    std::vector<unsigned int>::const_iterator iit;
    for( iit = begin; iit != end; vidx += *iit++ )
    {
        // Our new approach: we cut the poly along the plane, then we intersect the part on the black side of the plane
        // against the bounding polygon. All the white parts, and the black part outside the boundary polygon, are kept.
        std::vector<IfcVector3> whiteside, blackside;

        {
            const IfcVector3* srcVertices = &in[vidx];
            const size_t srcVtxCount = *iit;
            if( srcVtxCount == 0 )
                continue;

            IfcVector3 polyNormal = TempMesh::ComputePolygonNormal(srcVertices, srcVtxCount, true);

            // if the poly is parallel to the plane, put it completely on the black or white side
            if( std::abs(polyNormal * n) > 0.9999 )
            {
                bool isOnWhiteSide = (srcVertices[0] - p) * n > -1e-6;
                std::vector<IfcVector3>& targetSide = isOnWhiteSide ? whiteside : blackside;
                targetSide.insert(targetSide.end(), srcVertices, srcVertices + srcVtxCount);
            }
            else
            {
                // otherwise start building one polygon for each side. Whenever the current line segment intersects the plane
                // we put a point there as an end of the current segment. Then we switch to the other side, put a point there, too,
                // as a beginning of the current segment, and simply continue accumulating vertices.
                bool isCurrentlyOnWhiteSide = ((srcVertices[0]) - p) * n > -1e-6;
                for( size_t a = 0; a < srcVtxCount; ++a )
                {
                    IfcVector3 e0 = srcVertices[a];
                    IfcVector3 e1 = srcVertices[(a + 1) % srcVtxCount];
                    IfcVector3 ei;

                    // put starting point to the current mesh
                    std::vector<IfcVector3>& trgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                    trgt.push_back(srcVertices[a]);

                    // if there's an intersection, put an end vertex there, switch to the other side's mesh,
                    // and add a starting vertex there, too
                    bool isPlaneHit = IntersectSegmentPlane(p, n, e0, e1, isCurrentlyOnWhiteSide, ei);
                    if( isPlaneHit )
                    {
                        if( trgt.empty() || (trgt.back() - ei).SquareLength() > 1e-12 )
                            trgt.push_back(ei);
                        isCurrentlyOnWhiteSide = !isCurrentlyOnWhiteSide;
                        std::vector<IfcVector3>& newtrgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                        newtrgt.push_back(ei);
                    }
                }
            }
        }

        // the part on the white side can be written into the target mesh right away
        WritePolygon(whiteside, result);

        // The black part is the piece we need to get rid of, but only the part of it within the boundary polygon.
        // So we now need to construct all the polygons that result from BlackSidePoly minus BoundaryPoly.
        FilterPolygon(blackside);

        // Complicated, II. We run along the polygon. a) When we're inside the boundary, we run on until we hit an
        // intersection, which means we're leaving it. We then start a new out poly there. b) When we're outside the
        // boundary, we start collecting vertices until we hit an intersection, then we run along the boundary until we hit
        // an intersection, then we switch back to the poly and run on on this one again, and so on until we got a closed
        // loop. Then we continue with the path we left to catch potential additional polys on the other side of the
        // boundary as described in a)
        if( !blackside.empty() )
        {
            // poly edge index, intersection point, edge index in boundary poly
            std::vector<std::tuple<size_t, IfcVector3, size_t> > intersections;
            bool startedInside = PointInPoly(proj * blackside.front(), profile->mVerts);
            bool isCurrentlyInside = startedInside;

            std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;

            for( size_t a = 0; a < blackside.size(); ++a )
            {
                const IfcVector3 e0 = proj * blackside[a];
                const IfcVector3 e1 = proj * blackside[(a + 1) % blackside.size()];

                intersected_boundary.clear();
                IntersectsBoundaryProfile(e0, e1, profile->mVerts, isCurrentlyInside, intersected_boundary);
                // sort the hits by distance from e0 to get the correct in/out/in sequence. Manually :-( I miss you, C++11.
                if( intersected_boundary.size() > 1 )
                {
                    bool keepSorting = true;
                    while( keepSorting )
                    {
                        keepSorting = false;
                        for( size_t b = 0; b < intersected_boundary.size() - 1; ++b )
                        {
                            if( (intersected_boundary[b + 1].second - e0).SquareLength() < (intersected_boundary[b].second - e0).SquareLength() )
                            {
                                keepSorting = true;
                                std::swap(intersected_boundary[b + 1], intersected_boundary[b]);
                            }
                        }
                    }
                }
                // now add them to the list of intersections
                for( size_t b = 0; b < intersected_boundary.size(); ++b )
                    intersections.push_back(std::make_tuple(a, proj_inv * intersected_boundary[b].second, intersected_boundary[b].first));

                // and calculate our new inside/outside state
                if( intersected_boundary.size() & 1 )
                    isCurrentlyInside = !isCurrentlyInside;
            }

            // we got a list of in-out-combinations of intersections. That should be an even number of intersections, or
            // we're fucked.
            if( (intersections.size() & 1) != 0 )
            {
                IFCImporter::LogWarn("Odd number of intersections, can't work with that. Omitting half space boundary check.");
                continue;
            }

            if( intersections.size() > 1 )
            {
                // If we started outside, the first intersection is a out->in intersection. Cycle them so that it
                // starts with an intersection leaving the boundary
                if( !startedInside )
                for( size_t b = 0; b < intersections.size() - 1; ++b )
                    std::swap(intersections[b], intersections[(b + intersections.size() - 1) % intersections.size()]);

                // Filter pairs of out->in->out that lie too close to each other.
                for( size_t a = 0; intersections.size() > 0 && a < intersections.size() - 1; /**/ )
                {
                    if( (std::get<1>(intersections[a]) - std::get<1>(intersections[(a + 1) % intersections.size()])).SquareLength() < 1e-10 )
                        intersections.erase(intersections.begin() + a, intersections.begin() + a + 2);
                    else
                        a++;
                }
                if( intersections.size() > 1 && (std::get<1>(intersections.back()) - std::get<1>(intersections.front())).SquareLength() < 1e-10 )
                {
                    intersections.pop_back(); intersections.erase(intersections.begin());
                }
            }


            // no intersections at all: either completely inside the boundary, so everything gets discarded, or completely outside.
            // in the latter case we're implementional lost. I'm simply going to ignore this, so a large poly will not get any
            // holes if the boundary is smaller and does not touch it anywhere.
            if( intersections.empty() )
            {
                // starting point was outside -> everything is outside the boundary -> nothing is clipped -> add black side
                // to result mesh unchanged
                if( !startedInside )
                {
                    outvertcnt.push_back(static_cast<unsigned int>(blackside.size()));
                    outvert.insert(outvert.end(), blackside.begin(), blackside.end());
                    continue;
                }
                else
                {
                    // starting point was inside the boundary -> everything is inside the boundary -> nothing is spared from the
                    // clipping -> nothing left to add to the result mesh
                    continue;
                }
            }

            // determine the direction in which we're marching along the boundary polygon. If the src poly is faced upwards
            // and the boundary is also winded this way, we need to march *backwards* on the boundary.
            const IfcVector3 polyNormal = IfcMatrix3(proj) * TempMesh::ComputePolygonNormal(blackside.data(), blackside.size());
            bool marchBackwardsOnBoundary = (profileNormal * polyNormal) >= 0.0;

            // Build closed loops from these intersections. Starting from an intersection leaving the boundary we
            // walk along the polygon to the next intersection (which should be an IS entering the boundary poly).
            // From there we walk along the boundary until we hit another intersection leaving the boundary,
            // walk along the poly to the next IS and so on until we're back at the starting point.
            // We remove every intersection we "used up", so any remaining intersection is the start of a new loop.
            while( !intersections.empty() )
            {
                std::vector<IfcVector3> resultpoly;
                size_t currentIntersecIdx = 0;

                while( true )
                {
                    ai_assert(intersections.size() > currentIntersecIdx + 1);
                    std::tuple<size_t, IfcVector3, size_t> currintsec = intersections[currentIntersecIdx + 0];
                    std::tuple<size_t, IfcVector3, size_t> nextintsec = intersections[currentIntersecIdx + 1];
                    intersections.erase(intersections.begin() + currentIntersecIdx, intersections.begin() + currentIntersecIdx + 2);

                    // we start with an in->out intersection
                    resultpoly.push_back(std::get<1>(currintsec));
                    // climb along the polygon to the next intersection, which should be an out->in
                    size_t numPolyPoints = (std::get<0>(currintsec) > std::get<0>(nextintsec) ? blackside.size() : 0)
                        + std::get<0>(nextintsec) - std::get<0>(currintsec);
                    for( size_t a = 1; a <= numPolyPoints; ++a )
                        resultpoly.push_back(blackside[(std::get<0>(currintsec) + a) % blackside.size()]);
                    // put the out->in intersection
                    resultpoly.push_back(std::get<1>(nextintsec));

                    // generate segments along the boundary polygon that lie in the poly's plane until we hit another intersection
                    IfcVector3 startingPoint = proj * std::get<1>(nextintsec);
                    size_t currentBoundaryEdgeIdx = (std::get<2>(nextintsec) + (marchBackwardsOnBoundary ? 1 : 0)) % profile->mVerts.size();
                    size_t nextIntsecIdx = SIZE_MAX;
                    while( nextIntsecIdx == SIZE_MAX )
                    {
                        IfcFloat t = 1e10;

                        size_t nextBoundaryEdgeIdx = marchBackwardsOnBoundary ? (currentBoundaryEdgeIdx + profile->mVerts.size() - 1) : currentBoundaryEdgeIdx + 1;
                        nextBoundaryEdgeIdx %= profile->mVerts.size();
                        // vertices of the current boundary segments
                        IfcVector3 currBoundaryPoint = profile->mVerts[currentBoundaryEdgeIdx];
                        IfcVector3 nextBoundaryPoint = profile->mVerts[nextBoundaryEdgeIdx];
                        // project the two onto the polygon
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            currBoundaryPoint.z = startingPoint.z + (currBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (currBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                            nextBoundaryPoint.z = startingPoint.z + (nextBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (nextBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                        }

                        // build a direction that goes along the boundary border but lies in the poly plane
                        IfcVector3 boundaryPlaneNormal = ((nextBoundaryPoint - currBoundaryPoint) ^ profileNormal).Normalize();
                        IfcVector3 dirAtPolyPlane = (boundaryPlaneNormal ^ polyNormal).Normalize() * (marchBackwardsOnBoundary ? -1.0 : 1.0);
                        // if we can project the direction to the plane, we can calculate a maximum marching distance along that dir
                        // until we finish that boundary segment and continue on the next
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            t = std::min(t, (nextBoundaryPoint - startingPoint).Length());
                        }

                        // check if the direction hits the loop start - if yes, we got a poly to output
                        IfcVector3 dirToThatPoint = proj * resultpoly.front() - startingPoint;
                        IfcFloat tpt = dirToThatPoint * dirAtPolyPlane;
                        if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                        {
                            nextIntsecIdx = intersections.size(); // dirty hack to end marching along the boundary and signal the end of the loop
                            t = tpt;
                        }

                        // also check if the direction hits any in->out intersections earlier. If we hit one, we can switch back
                        // to marching along the poly border from that intersection point
                        for( size_t a = 0; a < intersections.size(); a += 2 )
                        {
                            dirToThatPoint = proj * std::get<1>(intersections[a]) - startingPoint;
                            tpt = dirToThatPoint * dirAtPolyPlane;
                            if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                            {
                                nextIntsecIdx = a; // switch back to poly and march on from this in->out intersection
                                t = tpt;
                            }
                        }

                        // if we keep marching on the boundary, put the segment end point to the result poly and well... keep marching
                        if( nextIntsecIdx == SIZE_MAX )
                        {
                            resultpoly.push_back(proj_inv * nextBoundaryPoint);
                            currentBoundaryEdgeIdx = nextBoundaryEdgeIdx;
                            startingPoint = nextBoundaryPoint;
                        }

                        // quick endless loop check
                        if( resultpoly.size() > blackside.size() + profile->mVerts.size() )
                        {
                            IFCImporter::LogError("Encountered endless loop while clipping polygon against poly-bounded half space.");
                            break;
                        }
                    }

                    // we're back on the poly - if this is the intersection we started from, we got a closed loop.
                    if( nextIntsecIdx >= intersections.size() )
                    {
                        break;
                    }

                    // otherwise it's another intersection. Continue marching from there.
                    currentIntersecIdx = nextIntsecIdx;
                }

                WritePolygon(resultpoly, result);
            }
        }
    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping with polygonal bounding (IfcBooleanClippingResult)");
}